

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_currencysymbols.cpp
# Opt level: O1

CurrencyUnit *
icu_63::number::impl::resolveCurrency
          (CurrencyUnit *__return_storage_ptr__,DecimalFormatProperties *properties,Locale *locale,
          UErrorCode *status)

{
  UErrorCode localStatus;
  char16_t buf [4];
  ConstChar16Ptr local_48 [3];
  UErrorCode local_2c;
  UChar local_28 [4];
  
  if ((properties->currency).fNull == false) {
    CurrencyUnit::CurrencyUnit(__return_storage_ptr__,&(properties->currency).fValue);
  }
  else {
    local_2c = U_ZERO_ERROR;
    local_28[0] = L'\0';
    local_28[1] = L'\0';
    local_28[2] = L'\0';
    local_28[3] = L'\0';
    ucurr_forLocale_63(locale->fullName,local_28,4,&local_2c);
    if (local_2c < U_ILLEGAL_ARGUMENT_ERROR) {
      local_48[0].p_ = local_28;
      CurrencyUnit::CurrencyUnit(__return_storage_ptr__,local_48,status);
    }
    else {
      CurrencyUnit::CurrencyUnit(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CurrencyUnit
icu::number::impl::resolveCurrency(const DecimalFormatProperties& properties, const Locale& locale,
                                   UErrorCode& status) {
    if (!properties.currency.isNull()) {
        return properties.currency.getNoError();
    } else {
        UErrorCode localStatus = U_ZERO_ERROR;
        char16_t buf[4] = {};
        ucurr_forLocale(locale.getName(), buf, 4, &localStatus);
        if (U_SUCCESS(localStatus)) {
            return CurrencyUnit(buf, status);
        } else {
            // Default currency (XXX)
            return CurrencyUnit();
        }
    }
}